

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testSampleImages.cpp
# Opt level: O0

void anon_unknown.dwarf_1ce5b9::compareImages(char *fileName1,char *fileName2)

{
  bool bVar1;
  ostream *poVar2;
  Rgba *pRVar3;
  char *in_RSI;
  char *in_RDI;
  float fVar4;
  float fVar5;
  size_t in_stack_00000078;
  size_t in_stack_00000080;
  Rgba *in_stack_00000088;
  RgbaInputFile *in_stack_00000090;
  int i;
  Array<Imf_2_5::Rgba> pixels2;
  Array<Imf_2_5::Rgba> pixels1;
  int dy;
  int dx;
  int h;
  int w;
  Box2i *dw;
  RgbaInputFile in2;
  RgbaInputFile in1;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  float in_stack_fffffffffffffeb4;
  int in_stack_fffffffffffffeb8;
  int in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  long in_stack_fffffffffffffed8;
  Array<Imf_2_5::Rgba> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  RgbaInputFile *in_stack_fffffffffffffef0;
  int local_cc;
  Array local_c8 [16];
  Array local_b8 [16];
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  Box2i *local_98;
  char *local_10;
  char *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  poVar2 = std::operator<<((ostream *)&std::cout,"comparing files ");
  poVar2 = std::operator<<(poVar2,local_8);
  poVar2 = std::operator<<(poVar2," and ");
  poVar2 = std::operator<<(poVar2,local_10);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            (in_stack_fffffffffffffef0,
             (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            (in_stack_fffffffffffffef0,
             (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (int)((ulong)in_stack_fffffffffffffee0 >> 0x20));
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f7a8d);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f7aa4);
  bVar1 = Imath_2_5::Box<Imath_2_5::Vec2<int>_>::operator==
                    ((Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
                     (Box<Imath_2_5::Vec2<int>_> *)
                     CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  if (!bVar1) {
    __assert_fail("in1.dataWindow() == in2.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                  ,0x6d,"void (anonymous namespace)::compareImages(const char *, const char *)");
  }
  local_98 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f7b2d);
  local_9c = ((local_98->max).x - (local_98->min).x) + 1;
  local_a0 = ((local_98->max).y - (local_98->min).y) + 1;
  local_a4 = (local_98->min).x;
  local_a8 = (local_98->min).y;
  Imf_2_5::Array<Imf_2_5::Rgba>::Array(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Imf_2_5::Array<Imf_2_5::Rgba>::Array(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  Imf_2_5::Array::operator_cast_to_Rgba_(local_b8);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  Imf_2_5::Array::operator_cast_to_Rgba_(local_c8);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            (in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f7c88);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f7ca8);
  Imf_2_5::RgbaInputFile::readPixels
            ((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f7cd7);
  Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)0x1f7cf7);
  Imf_2_5::RgbaInputFile::readPixels
            ((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
             in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
  local_cc = 0;
  while( true ) {
    if (local_9c * local_a0 <= local_cc) {
      Imf_2_5::Array<Imf_2_5::Rgba>::~Array
                ((Array<Imf_2_5::Rgba> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      Imf_2_5::Array<Imf_2_5::Rgba>::~Array
                ((Array<Imf_2_5::Rgba> *)
                 CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
      Imf_2_5::RgbaInputFile::~RgbaInputFile
                ((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      Imf_2_5::RgbaInputFile::~RgbaInputFile
                ((RgbaInputFile *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      return;
    }
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_b8);
    fVar4 = half::operator_cast_to_float(&pRVar3[local_cc].r);
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_c8);
    fVar5 = half::operator_cast_to_float(&pRVar3[local_cc].r);
    bVar1 = approximatelyEqual(fVar4,fVar5);
    if (!bVar1) {
      __assert_fail("approximatelyEqual (pixels1[i].r, pixels2[i].r)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                    ,0x81,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_b8);
    fVar4 = half::operator_cast_to_float(&pRVar3[local_cc].g);
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_c8);
    fVar5 = half::operator_cast_to_float(&pRVar3[local_cc].g);
    bVar1 = approximatelyEqual(fVar4,fVar5);
    if (!bVar1) {
      __assert_fail("approximatelyEqual (pixels1[i].g, pixels2[i].g)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                    ,0x82,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_b8);
    fVar4 = half::operator_cast_to_float(&pRVar3[local_cc].b);
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_c8);
    in_stack_fffffffffffffeb4 = half::operator_cast_to_float(&pRVar3[local_cc].b);
    bVar1 = approximatelyEqual(fVar4,in_stack_fffffffffffffeb4);
    in_stack_fffffffffffffeb0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeb0);
    if (!bVar1) break;
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_b8);
    fVar4 = half::operator_cast_to_float(&pRVar3[local_cc].a);
    pRVar3 = Imf_2_5::Array::operator_cast_to_Rgba_(local_c8);
    fVar5 = half::operator_cast_to_float(&pRVar3[local_cc].a);
    in_stack_fffffffffffffea7 = approximatelyEqual(fVar4,fVar5);
    if (!(bool)in_stack_fffffffffffffea7) {
      __assert_fail("approximatelyEqual (pixels1[i].a, pixels2[i].a)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                    ,0x84,"void (anonymous namespace)::compareImages(const char *, const char *)");
    }
    local_cc = local_cc + 1;
  }
  __assert_fail("approximatelyEqual (pixels1[i].b, pixels2[i].b)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testSampleImages.cpp"
                ,0x83,"void (anonymous namespace)::compareImages(const char *, const char *)");
}

Assistant:

void
compareImages (const char fileName1[], const char fileName2[])
{
    cout << "comparing files " << fileName1 << " and " << fileName2 << endl;

    OPENEXR_IMF_NAMESPACE::RgbaInputFile in1 (fileName1);
    OPENEXR_IMF_NAMESPACE::RgbaInputFile in2 (fileName1);

    assert (in1.dataWindow() == in2.dataWindow());

    const Box2i &dw = in1.dataWindow();

    int w = dw.max.x - dw.min.x + 1;
    int h = dw.max.y - dw.min.y + 1;
    int dx = dw.min.x;
    int dy = dw.min.y;

    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels1 (w * h);
    Array<OPENEXR_IMF_NAMESPACE::Rgba> pixels2 (w * h);

    in1.setFrameBuffer (pixels1 - dx - dy * w, 1, w);
    in2.setFrameBuffer (pixels2 - dx - dy * w, 1, w);

    in1.readPixels (in1.dataWindow().min.y, in1.dataWindow().max.y);
    in2.readPixels (in2.dataWindow().min.y, in2.dataWindow().max.y);

    for (int i = 0; i < w * h; ++i)
    {
	assert (approximatelyEqual (pixels1[i].r, pixels2[i].r));
	assert (approximatelyEqual (pixels1[i].g, pixels2[i].g));
	assert (approximatelyEqual (pixels1[i].b, pixels2[i].b));
	assert (approximatelyEqual (pixels1[i].a, pixels2[i].a));
    }
}